

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int coda_ascbin_cursor_goto_array_element(coda_cursor *cursor,int num_subs,long *subs)

{
  int64_t *piVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  coda_type *pcVar7;
  int64_t var_dim;
  long local_48;
  char *local_40;
  long *local_38;
  
  pcVar7 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  local_38 = subs;
  if (*(int *)&pcVar7[1].name == num_subs) {
    if (*(int *)&pcVar7[1].name < 1) {
      local_48 = 0;
    }
    else {
      lVar6 = 0;
      local_48 = 0;
      do {
        pcVar5 = (&pcVar7[1].description)[lVar6];
        if (((&pcVar7[1].description)[lVar6] == (char *)0xffffffffffffffff) &&
           (iVar4 = coda_expression_eval_integer
                              ((coda_expression *)(&pcVar7[2].bit_size)[lVar6],cursor,
                               (int64_t *)&local_40), pcVar5 = local_40, iVar4 != 0)) {
          coda_add_error_message(" for dim[%d] expression",lVar6);
          coda_cursor_add_to_error_message(cursor);
          bVar3 = false;
        }
        else {
          lVar2 = local_38[lVar6];
          if ((lVar2 < 0) || ((long)pcVar5 <= lVar2)) {
            bVar3 = false;
            coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",lVar2,pcVar5);
          }
          else {
            if (lVar6 == 0) {
              pcVar5 = (char *)0x1;
            }
            local_48 = (long)pcVar5 * local_48 + lVar2;
            bVar3 = true;
          }
        }
        if (!bVar3) goto LAB_00187eb7;
        lVar6 = lVar6 + 1;
      } while (lVar6 < *(int *)&pcVar7[1].name);
    }
    iVar4 = cursor->n;
    cursor->n = iVar4 + 1;
    lVar6 = cursor->stack[(long)iVar4 + -1].bit_offset;
    cursor->stack[iVar4].bit_offset = lVar6;
    if ((*(coda_type **)(pcVar7 + 1))->bit_size < 0) {
      if (0 < local_48) {
        lVar6 = 0;
        do {
          iVar4 = cursor->n;
          cursor->stack[(long)iVar4 + -1].type =
               (coda_dynamic_type_struct *)*(coda_type **)(pcVar7 + 1);
          cursor->stack[(long)iVar4 + -1].index = lVar6;
          iVar4 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_40);
          if (iVar4 != 0) {
            cursor->n = cursor->n + -1;
            goto LAB_00187eb7;
          }
          piVar1 = &cursor->stack[(long)cursor->n + -1].bit_offset;
          *piVar1 = (int64_t)(local_40 + *piVar1);
          lVar6 = lVar6 + 1;
        } while (local_48 != lVar6);
      }
    }
    else {
      cursor->stack[iVar4].bit_offset = (*(coda_type **)(pcVar7 + 1))->bit_size * local_48 + lVar6;
    }
    iVar4 = cursor->n;
    cursor->stack[(long)iVar4 + -1].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar7 + 1);
    cursor->stack[(long)iVar4 + -1].index = local_48;
    iVar4 = 0;
  }
  else {
    coda_set_error(-0x6a,"number of dimensions argument (%d) does not match rank of  array (%d)");
LAB_00187eb7:
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int coda_ascbin_cursor_goto_array_element(coda_cursor *cursor, int num_subs, const long subs[])
{
    coda_type_array *array;
    long offset_elements;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the number of dimensions */
    if (num_subs != array->num_dims)
    {
        coda_set_error(CODA_ERROR_ARRAY_NUM_DIMS_MISMATCH, "number of dimensions argument (%d) does not match rank of "
                       " array (%d)", num_subs, array->num_dims);
        return -1;
    }

    /* check the dimensions... */
    offset_elements = 0;
    for (i = 0; i < array->num_dims; i++)
    {
        long dim;

        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim = (long)var_dim;
        }
        else
        {
            dim = array->dim[i];
        }

        if (subs[i] < 0 || subs[i] >= dim)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", subs[i],
                           dim);
            return -1;
        }
        if (i > 0)
        {
            offset_elements *= dim;
        }
        offset_elements += subs[i];
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += offset_elements * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < offset_elements; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = offset_elements;

    return 0;
}